

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

int __thiscall ON_ClippingRegion::InClipPlaneRegion(ON_ClippingRegion *this,ON_BoundingBox *bbox)

{
  double dVar1;
  bool bVar2;
  undefined1 local_e8 [8];
  ON_3dPoint P [8];
  ON_BoundingBox *bbox_local;
  ON_ClippingRegion *this_local;
  
  bVar2 = ON_IsValid((bbox->m_min).x);
  if (((!bVar2) || (bVar2 = ON_IsValid((bbox->m_max).x), !bVar2)) ||
     (dVar1 = (bbox->m_min).x, (bbox->m_max).x <= dVar1 && dVar1 != (bbox->m_max).x)) {
    this_local._4_4_ = 0;
  }
  else if (this->m_clip_plane_count < 1) {
    this_local._4_4_ = 2;
  }
  else {
    local_e8 = (undefined1  [8])(bbox->m_min).x;
    P[0].x = (bbox->m_min).y;
    P[0].y = (bbox->m_min).z;
    P[0].z = (bbox->m_max).x;
    P[1].x = (bbox->m_max).y;
    P[1].y = (bbox->m_max).z;
    P[1].z = (bbox->m_min).x;
    P[2].x = (bbox->m_min).y;
    P[2].y = (bbox->m_max).z;
    P[2].z = (bbox->m_min).x;
    P[3].x = (bbox->m_max).y;
    P[3].y = (bbox->m_min).z;
    P[3].z = (bbox->m_min).x;
    P[4].x = (bbox->m_max).y;
    P[4].y = (bbox->m_max).z;
    P[4].z = (bbox->m_max).x;
    P[5].x = (bbox->m_min).y;
    P[5].y = (bbox->m_min).z;
    P[5].z = (bbox->m_max).x;
    P[6].x = (bbox->m_min).y;
    P[6].y = (bbox->m_max).z;
    P[6].z = (bbox->m_max).x;
    P[7].x = (bbox->m_max).y;
    P[7].y = (bbox->m_min).z;
    this_local._4_4_ = InClipPlaneRegion(this,8,(ON_3dPoint *)local_e8);
  }
  return this_local._4_4_;
}

Assistant:

int ON_ClippingRegion::InClipPlaneRegion( 
  const ON_BoundingBox& bbox
  ) const
{
  if (    !ON_IsValid(bbox.m_min.x) 
       || !ON_IsValid(bbox.m_max.x) 
       || bbox.m_min.x > bbox.m_max.x
       )
  {
    return 0;
  }

  if ( m_clip_plane_count <= 0 )
  {
    return 2;
  }

  ON_3dPoint P[8];
  P[0] = bbox.m_min;
  P[1] = bbox.m_max;
  P[2].x = bbox.m_min.x; P[2].y = bbox.m_min.y; P[2].z = bbox.m_max.z;
  P[3].x = bbox.m_min.x; P[3].y = bbox.m_max.y; P[3].z = bbox.m_min.z;
  P[4].x = bbox.m_min.x; P[4].y = bbox.m_max.y; P[4].z = bbox.m_max.z;
  P[5].x = bbox.m_max.x; P[5].y = bbox.m_min.y; P[5].z = bbox.m_min.z;
  P[6].x = bbox.m_max.x; P[6].y = bbox.m_min.y; P[6].z = bbox.m_max.z;
  P[7].x = bbox.m_max.x; P[7].y = bbox.m_max.y; P[7].z = bbox.m_min.z;

  return InClipPlaneRegion(8,P);
}